

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

void Abc_TtCofactorTest10(word *pTruth,int nVars,int N)

{
  int nWords_00;
  int iVar1;
  int local_20;
  int i;
  int nWords;
  int N_local;
  int nVars_local;
  word *pTruth_local;
  
  nWords_00 = Abc_TtWordNum(nVars);
  local_20 = 0;
  while( true ) {
    if (nVars + -1 <= local_20) {
      return;
    }
    Abc_TtCopy(Abc_TtCofactorTest10::pCopy1,pTruth,nWords_00,0);
    Abc_TtSwapAdjacent(Abc_TtCofactorTest10::pCopy1,nWords_00,local_20);
    Abc_TtCopy(Abc_TtCofactorTest10::pCopy2,pTruth,nWords_00,0);
    Abc_TtSwapVars(Abc_TtCofactorTest10::pCopy2,nVars,local_20,local_20 + 1);
    iVar1 = Abc_TtEqual(Abc_TtCofactorTest10::pCopy1,Abc_TtCofactorTest10::pCopy2,nWords_00);
    if (iVar1 == 0) break;
    local_20 = local_20 + 1;
  }
  __assert_fail("Abc_TtEqual( pCopy1, pCopy2, nWords )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                ,0x2d0,"void Abc_TtCofactorTest10(word *, int, int)");
}

Assistant:

void Abc_TtCofactorTest10( word * pTruth, int nVars, int N )
{
    static word pCopy1[1024];
    static word pCopy2[1024];
    int nWords = Abc_TtWordNum( nVars );
    int i;
    for ( i = 0; i < nVars - 1; i++ )
    {
//        Kit_DsdPrintFromTruth( pTruth, nVars ); printf( "\n" );
        Abc_TtCopy( pCopy1, pTruth, nWords, 0 );
        Abc_TtSwapAdjacent( pCopy1, nWords, i );
//        Kit_DsdPrintFromTruth( pCopy1, nVars ); printf( "\n" );
        Abc_TtCopy( pCopy2, pTruth, nWords, 0 );
        Abc_TtSwapVars( pCopy2, nVars, i, i+1 );
//        Kit_DsdPrintFromTruth( pCopy2, nVars ); printf( "\n" );
        assert( Abc_TtEqual( pCopy1, pCopy2, nWords ) );
    }
}